

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_2631452::ReaderSpy::~ReaderSpy(ReaderSpy *this)

{
  this->super_Reader = (Reader)&PTR__ReaderSpy_00ab2318;
  std::__cxx11::string::~string((string *)&this->prefix);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->s).super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->r).super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

ReaderSpy(const std::shared_ptr<dap::Reader>& r,
            const std::shared_ptr<dap::Writer>& s,
            const std::string& prefix)
      : r(r), s(s), prefix(prefix) {}